

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_server.cpp
# Opt level: O2

int __thiscall CNetServer::Recv(CNetServer *this,CNetChunk *pChunk,TOKEN *pResponseToken)

{
  CNetRecvUnpacker *this_00;
  CNetPacketConstruct *pPacket;
  uchar *puVar1;
  NETADDR_conflict *pNVar2;
  uint uVar3;
  long lVar4;
  undefined8 uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  TOKEN TVar13;
  long lVar14;
  CNetConnection *this_01;
  int i;
  NETADDR *a;
  int iVar15;
  long in_FS_OFFSET;
  int LastInfoQuery;
  char FullMsg [20];
  char aBuf [128];
  NETADDR_conflict Addr;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->m_RecvUnpacker;
  pPacket = &(this->m_RecvUnpacker).m_Data;
  puVar1 = (this->m_RecvUnpacker).m_Data.m_aChunkData;
  pNVar2 = &this->m_aSlots[0].m_Connection.m_PeerAddr;
  iVar15 = 1;
LAB_00136c9d:
  do {
    if ((this_00->m_Valid == true) &&
       (iVar11 = CNetRecvUnpacker::FetchChunk(this_00,pChunk), iVar11 != 0)) goto LAB_0013701e;
    iVar11 = CNetBase::UnpackPacket
                       (&this->super_CNetBase,(NETADDR *)&Addr,(this->m_RecvUnpacker).m_aBuffer,
                        pPacket);
    if (0 < iVar11) {
      iVar15 = 0;
      goto LAB_0013701e;
    }
    if (iVar11 == 0) {
      if ((this->m_pNetBan == (CNetBan *)0x0) ||
         (bVar10 = CNetBan::IsBanned(this->m_pNetBan,&Addr,aBuf,0x80,&LastInfoQuery), !bVar10)) {
        bVar10 = false;
        a = (NETADDR *)pNVar2;
        for (lVar14 = 0; lVar14 != 0x40; lVar14 = lVar14 + 1) {
          if ((*(int *)(a[-0x59f].ip + 4) != 0) &&
             (iVar11 = net_addr_comp(a,(NETADDR *)&Addr,1), iVar11 == 0)) {
            iVar11 = CNetConnection::Feed((CNetConnection *)(a + -0x59f),pPacket,&Addr);
            bVar10 = true;
            if ((iVar11 != 0) && ((this->m_RecvUnpacker).m_Data.m_DataSize != 0)) {
              if (((this->m_RecvUnpacker).m_Data.m_Flags & 8) != 0) {
                pChunk->m_Flags = 2;
                uVar6 = a->ip[0];
                uVar7 = a->ip[1];
                uVar8 = a->ip[2];
                uVar9 = a->ip[3];
                uVar5 = *(undefined8 *)(a->ip + 4);
                (pChunk->m_Address).type = a->type;
                (pChunk->m_Address).ip[0] = uVar6;
                (pChunk->m_Address).ip[1] = uVar7;
                (pChunk->m_Address).ip[2] = uVar8;
                (pChunk->m_Address).ip[3] = uVar9;
                *(undefined8 *)((pChunk->m_Address).ip + 4) = uVar5;
                *(undefined8 *)((pChunk->m_Address).ip + 0xc) = *(undefined8 *)(a->ip + 0xc);
                pChunk->m_ClientID = (int)lVar14;
                pChunk->m_DataSize = (this->m_RecvUnpacker).m_Data.m_DataSize;
                pChunk->m_pData = puVar1;
                if (pResponseToken == (TOKEN *)0x0) goto LAB_0013701e;
                TVar13 = 0xffffffff;
                goto LAB_0013701c;
              }
              CNetRecvUnpacker::Start
                        (this_00,(NETADDR *)&Addr,(CNetConnection *)(a + -0x59f),(int)lVar14);
            }
          }
          a = a + 0x5a1;
        }
        if ((!bVar10) &&
           (iVar11 = CNetTokenManager::ProcessMessage
                               (&this->m_TokenManager,(NETADDR *)&Addr,pPacket), 0 < iVar11)) {
          uVar3 = (this->m_RecvUnpacker).m_Data.m_Flags;
          if ((uVar3 & 1) == 0) {
            if ((uVar3 & 8) != 0) {
              pChunk->m_Flags = 2;
              pChunk->m_ClientID = -1;
              (pChunk->m_Address).type = Addr.type;
              (pChunk->m_Address).ip[0] = Addr.ip[0];
              (pChunk->m_Address).ip[1] = Addr.ip[1];
              (pChunk->m_Address).ip[2] = Addr.ip[2];
              (pChunk->m_Address).ip[3] = Addr.ip[3];
              *(undefined8 *)((pChunk->m_Address).ip + 4) = Addr.ip._4_8_;
              *(undefined8 *)((pChunk->m_Address).ip + 0xc) = Addr._16_8_;
              pChunk->m_DataSize = (this->m_RecvUnpacker).m_Data.m_DataSize;
              pChunk->m_pData = puVar1;
              if (pResponseToken != (TOKEN *)0x0) {
                TVar13 = (this->m_RecvUnpacker).m_Data.m_ResponseToken;
LAB_0013701c:
                *pResponseToken = TVar13;
              }
LAB_0013701e:
              if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
                __stack_chk_fail();
              }
              return iVar15;
            }
          }
          else if (*puVar1 == '\x05') {
            CNetTokenCache::AddToken
                      (&this->m_TokenCache,(NETADDR *)&Addr,
                       (this->m_RecvUnpacker).m_Data.m_ResponseToken,2);
          }
          else if (*puVar1 == '\x01') {
            if (this->m_NumClients < this->m_MaxClients) {
              iVar11 = iVar15;
              for (lVar14 = 0; lVar14 != 0x21c600; lVar14 = lVar14 + 0x8718) {
                if ((*(int *)(this->m_aSlots[0].m_Connection.m_Buffer.m_aBuffer + lVar14 + -0x38) !=
                     0) && (iVar12 = net_addr_comp((NETADDR *)&Addr,
                                                   (NETADDR *)(pNVar2->ip + lVar14 + -4),0),
                           iVar12 == 0)) {
                  if (this->m_MaxClientsPerIP <= iVar11) {
                    str_format(FullMsg,0x80,"Only %d players with the same IP are allowed");
                    TVar13 = (this->m_RecvUnpacker).m_Data.m_ResponseToken;
                    iVar11 = str_length(FullMsg);
                    CNetBase::SendControlMsg
                              (&this->super_CNetBase,(NETADDR *)&Addr,TVar13,0,4,FullMsg,iVar11 + 1)
                    ;
                    goto LAB_00136c9d;
                  }
                  iVar11 = iVar11 + 1;
                }
              }
              lVar14 = 0;
              this_01 = &this->m_aSlots[0].m_Connection;
              for (; lVar14 != 0x40; lVar14 = lVar14 + 1) {
                if (this_01->m_State == 0) {
                  this->m_NumClients = this->m_NumClients + 1;
                  CNetConnection::SetToken(this_01,(this->m_RecvUnpacker).m_Data.m_Token);
                  CNetConnection::Feed(this_01,pPacket,&Addr);
                  if (this->m_pfnNewClient != (NETFUNC_NEWCLIENT)0x0) {
                    (*this->m_pfnNewClient)((int)lVar14,this->m_UserPtr);
                  }
                  break;
                }
                this_01 = this_01 + 1;
              }
            }
            else {
              builtin_strncpy(FullMsg,"This server is full",0x14);
              CNetBase::SendControlMsg
                        (&this->super_CNetBase,(NETADDR *)&Addr,
                         (this->m_RecvUnpacker).m_Data.m_ResponseToken,0,4,FullMsg,0x14);
            }
          }
        }
      }
      else {
        iVar11 = time_timestamp();
        if (LastInfoQuery + 5 < iVar11) {
          TVar13 = (this->m_RecvUnpacker).m_Data.m_ResponseToken;
          iVar11 = str_length(aBuf);
          CNetBase::SendControlMsg
                    (&this->super_CNetBase,(NETADDR *)&Addr,TVar13,0,4,aBuf,iVar11 + 1);
        }
      }
    }
  } while( true );
}

Assistant:

int CNetServer::Recv(CNetChunk *pChunk, TOKEN *pResponseToken)
{
	while(1)
	{
		// check for a chunk
		if(m_RecvUnpacker.IsActive() && m_RecvUnpacker.FetchChunk(pChunk))
			return 1;

		// TODO: empty the recvinfo
		NETADDR Addr;
		int Result = UnpackPacket(&Addr, m_RecvUnpacker.m_aBuffer, &m_RecvUnpacker.m_Data);
		// no more packets for now
		if(Result > 0)
			break;

		if(!Result)
		{
			// check for bans
			char aBuf[128];
			int LastInfoQuery;
			if(NetBan() && NetBan()->IsBanned(&Addr, aBuf, sizeof(aBuf), &LastInfoQuery))
			{
				// banned, reply with a message (5 second cooldown)
				int Time = time_timestamp();
				if(LastInfoQuery + 5 < Time)
				{
					SendControlMsg(&Addr, m_RecvUnpacker.m_Data.m_ResponseToken, 0, NET_CTRLMSG_CLOSE, aBuf, str_length(aBuf) + 1);
				}
				continue;
			}

			bool Found = false;
			// try to find matching slot
			for(int i = 0; i < NET_MAX_CLIENTS; i++)
			{
				if(m_aSlots[i].m_Connection.State() == NET_CONNSTATE_OFFLINE)
					continue;

				if(net_addr_comp(m_aSlots[i].m_Connection.PeerAddress(), &Addr, true) == 0)
				{
					if(m_aSlots[i].m_Connection.Feed(&m_RecvUnpacker.m_Data, &Addr))
					{
						if(m_RecvUnpacker.m_Data.m_DataSize)
						{
							if(!(m_RecvUnpacker.m_Data.m_Flags&NET_PACKETFLAG_CONNLESS))
								m_RecvUnpacker.Start(&Addr, &m_aSlots[i].m_Connection, i);
							else
							{
								pChunk->m_Flags = NETSENDFLAG_CONNLESS;
								pChunk->m_Address = *m_aSlots[i].m_Connection.PeerAddress();
								pChunk->m_ClientID = i;
								pChunk->m_DataSize = m_RecvUnpacker.m_Data.m_DataSize;
								pChunk->m_pData = m_RecvUnpacker.m_Data.m_aChunkData;
								if(pResponseToken)
									*pResponseToken = NET_TOKEN_NONE;
								return 1;
							}
						}
					}
					Found = true;
				}
			}

			if(Found)
				continue;

			int Accept = m_TokenManager.ProcessMessage(&Addr, &m_RecvUnpacker.m_Data);
			if(Accept <= 0)
				continue;

			if(m_RecvUnpacker.m_Data.m_Flags&NET_PACKETFLAG_CONTROL)
			{
				if(m_RecvUnpacker.m_Data.m_aChunkData[0] == NET_CTRLMSG_CONNECT)
				{
					// check if there are free slots
					if(m_NumClients >= m_MaxClients)
					{
						const char FullMsg[] = "This server is full";
						SendControlMsg(&Addr, m_RecvUnpacker.m_Data.m_ResponseToken, 0, NET_CTRLMSG_CLOSE, FullMsg, sizeof(FullMsg));
						continue;
					}

					// only allow a specific number of players with the same ip
					int FoundAddr = 1;
					
					bool Continue = false;
					for(int i = 0; i < NET_MAX_CLIENTS; i++)
					{
						if(m_aSlots[i].m_Connection.State() == NET_CONNSTATE_OFFLINE)
							continue;

						if(!net_addr_comp(&Addr, m_aSlots[i].m_Connection.PeerAddress(), false))
						{
							if(FoundAddr++ >= m_MaxClientsPerIP)
							{
								char aBuf[128];
								str_format(aBuf, sizeof(aBuf), "Only %d players with the same IP are allowed", m_MaxClientsPerIP);
								SendControlMsg(&Addr, m_RecvUnpacker.m_Data.m_ResponseToken, 0, NET_CTRLMSG_CLOSE, aBuf, str_length(aBuf) + 1);
								Continue = true;
								break;
							}
						}
					}

					if(Continue)
						continue;

					for(int i = 0; i < NET_MAX_CLIENTS; i++)
					{
						if(m_aSlots[i].m_Connection.State() == NET_CONNSTATE_OFFLINE)
						{
							m_NumClients++;
							m_aSlots[i].m_Connection.SetToken(m_RecvUnpacker.m_Data.m_Token);
							m_aSlots[i].m_Connection.Feed(&m_RecvUnpacker.m_Data, &Addr);
							if(m_pfnNewClient)
								m_pfnNewClient(i, m_UserPtr);
							break;
						}
					}
				}
				else if(m_RecvUnpacker.m_Data.m_aChunkData[0] == NET_CTRLMSG_TOKEN)
					m_TokenCache.AddToken(&Addr, m_RecvUnpacker.m_Data.m_ResponseToken, NET_TOKENFLAG_RESPONSEONLY);
			}
			else if(m_RecvUnpacker.m_Data.m_Flags&NET_PACKETFLAG_CONNLESS)
			{
				pChunk->m_Flags = NETSENDFLAG_CONNLESS;
				pChunk->m_ClientID = -1;
				pChunk->m_Address = Addr;
				pChunk->m_DataSize = m_RecvUnpacker.m_Data.m_DataSize;
				pChunk->m_pData = m_RecvUnpacker.m_Data.m_aChunkData;
				if(pResponseToken)
					*pResponseToken = m_RecvUnpacker.m_Data.m_ResponseToken;
				return 1;
			}
		}
	}
	return 0;
}